

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QOcspResponsePrivate>::detach_helper
          (QSharedDataPointer<QOcspResponsePrivate> *this)

{
  long lVar1;
  int *piVar2;
  void *pvVar3;
  int *piVar4;
  
  piVar4 = (int *)operator_new(0x20);
  lVar1 = *(long *)this;
  *piVar4 = 0;
  *(undefined8 *)(piVar4 + 1) = *(undefined8 *)(lVar1 + 4);
  QSslCertificate::QSslCertificate
            ((QSslCertificate *)(piVar4 + 4),(QSslCertificate *)(lVar1 + 0x10));
  QSslCertificate::QSslCertificate
            ((QSslCertificate *)(piVar4 + 6),(QSslCertificate *)(lVar1 + 0x18));
  LOCK();
  *piVar4 = *piVar4 + 1;
  UNLOCK();
  piVar2 = *(int **)this;
  LOCK();
  *piVar2 = *piVar2 + -1;
  UNLOCK();
  if (*piVar2 == 0) {
    pvVar3 = *(void **)this;
    if (pvVar3 != (void *)0x0) {
      QSslCertificate::~QSslCertificate((QSslCertificate *)((long)pvVar3 + 0x18));
      QSslCertificate::~QSslCertificate((QSslCertificate *)((long)pvVar3 + 0x10));
    }
    operator_delete(pvVar3,0x20);
  }
  *(int **)this = piVar4;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}